

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void field(LexState *ls,expdesc *v)

{
  FuncState *fs;
  expdesc key;
  expdesc eStack_38;
  
  fs = ls->fs;
  luaK_exp2anyreg(fs,v);
  luaX_next(ls);
  checkname(ls,&eStack_38);
  luaK_indexed(fs,v,&eStack_38);
  return;
}

Assistant:

static void field(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
expdesc key;
luaK_exp2anyreg(fs,v);
luaX_next(ls);
checkname(ls,&key);
luaK_indexed(fs,v,&key);
}